

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkipList.hpp
# Opt level: O3

Clause * __thiscall
Lib::SkipList<Kernel::Clause_*,_Lib::Int>::pop(SkipList<Kernel::Clause_*,_Lib::Int> *this)

{
  uint uVar1;
  Clause *pCVar2;
  Clause *pCVar3;
  Node *pNVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  
  pCVar2 = (Clause *)this->_left->nodes[0];
  uVar1 = this->_top;
  uVar5 = 1;
  uVar6 = uVar5;
  if (1 < uVar1) {
    pNVar4 = this->_left + 1;
    do {
      uVar6 = uVar5;
      if (pNVar4->value != pCVar2) break;
      uVar5 = uVar5 + 1;
      pNVar4 = (Node *)pNVar4->nodes;
      uVar6 = uVar1;
    } while (uVar1 != uVar5);
  }
  uVar7 = 0;
  do {
    this->_left->nodes[uVar7] = (Node *)pCVar2->_literals[uVar7 - 0xd];
    uVar7 = uVar7 + 1;
  } while (uVar6 != uVar7);
  pCVar3 = *(Clause **)&pCVar2->super_Unit;
  uVar7 = (ulong)(uVar6 - 1) * 8 + 0x1f & 0xffffffff0;
  if (uVar7 == 0) {
    *(undefined8 *)&pCVar2->super_Unit = GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
    GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = pCVar2;
  }
  else if (uVar7 < 0x11) {
    *(undefined8 *)&pCVar2->super_Unit = GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
    GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = pCVar2;
  }
  else if (uVar7 < 0x19) {
    *(undefined8 *)&pCVar2->super_Unit = GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
    GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = pCVar2;
  }
  else if (uVar7 < 0x21) {
    *(undefined8 *)&pCVar2->super_Unit = GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
    GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = pCVar2;
  }
  else if (uVar7 < 0x31) {
    *(undefined8 *)&pCVar2->super_Unit = GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
    GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = pCVar2;
  }
  else if (uVar7 < 0x41) {
    *(undefined8 *)&pCVar2->super_Unit = GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
    GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = pCVar2;
  }
  else {
    operator_delete(pCVar2,0x10);
  }
  return pCVar3;
}

Assistant:

Value pop()
  {
    ASS(isNonEmpty());

    // find the height of the first
    Node* node = _left->nodes[0];
    unsigned h;
    for (h = 1;h < _top;h++) {
      if (_left->nodes[h] != node) {
	break;
      }
    }
    // the height of the first node is h-1
    for (unsigned i = 0;i < h;i++) {
      _left->nodes[i] = node->nodes[i];
    }
    Value val = node->value;
    deallocate(node,h-1);
    return val;
  }